

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O0

double __thiscall Liby::Logger::log(Logger *this,double __x)

{
  char **__buf;
  char in_AL;
  int iVar1;
  char *pcVar2;
  undefined8 uVar3;
  size_t __n;
  ssize_t sVar4;
  undefined4 in_ECX;
  undefined8 in_RDX;
  LogLevel in_ESI;
  undefined8 in_R8;
  char *in_R9;
  bool bVar5;
  double extraout_XMM0_Qa;
  undefined1 local_1158 [48];
  double local_1128;
  int local_109c [2];
  int ret;
  va_list args;
  string local_1070;
  char **local_1050;
  char *buf;
  char buffer [4096];
  int local_3c;
  int buffersize;
  int offset;
  char *fmt_local;
  char *func_local;
  int line_local;
  char *file_local;
  LogLevel level_local;
  Logger *this_local;
  
  if (in_AL != '\0') {
    local_1128 = __x;
  }
  if ((int)this->level_ <= (int)in_ESI) {
    local_1050 = &buf;
    pcVar2 = getLevelString(in_ESI);
    Timestamp::now();
    Timestamp::toString_abi_cxx11_(&local_1070,(Timestamp *)&args[0].reg_save_area);
    uVar3 = std::__cxx11::string::c_str();
    iVar1 = snprintf((char *)&buf,0x1000,"[%s] [%s]: %s: %d %s ",pcVar2,uVar3,in_RDX,in_ECX,in_R8);
    std::__cxx11::string::~string((string *)&local_1070);
    args[0].overflow_arg_area = local_1158;
    args[0]._0_8_ = &stack0x00000008;
    ret = 0x30;
    local_109c[1] = 0x30;
    local_3c = vsnprintf((char *)((long)local_1050 + (long)iVar1),(long)(0x1000 - iVar1),in_R9,
                         local_109c + 1);
    __buf = local_1050;
    local_3c = local_3c + iVar1;
    while( true ) {
      bVar5 = true;
      if (*(char *)((long)local_1050 + (long)local_3c) != '\n') {
        bVar5 = *(char *)((long)local_1050 + (long)local_3c) == '\0';
      }
      if (!bVar5) break;
      local_3c = local_3c + -1;
    }
    *(undefined1 *)((long)local_1050 + (long)(local_3c + 1)) = 10;
    *(undefined1 *)((long)local_1050 + (long)(local_3c + 2)) = 0;
    __n = strlen((char *)local_1050);
    sVar4 = write(2,__buf,__n);
    local_109c[0] = (int)sVar4;
    ClearUnuseVariableWarning<int&>(local_109c);
    __x = extraout_XMM0_Qa;
  }
  return __x;
}

Assistant:

void Logger::log(LogLevel level, const char *file, const int line,
                 const char *func, const char *fmt...) {
    if (level < level_)
        return;
    int offset = 0;
    const int buffersize = 4096;
    char buffer[buffersize];
    char *buf = buffer;

    offset += snprintf(buf + offset, buffersize - offset,
                       "[%s] [%s]: %s: %d %s ", Logger::getLevelString(level),
                       Timestamp::now().toString().c_str(), file, line, func);

    va_list args;
    va_start(args, fmt);
    offset += vsnprintf(buf + offset, buffersize - offset, fmt, args);
    va_end(args);

    while (buf[offset] == '\n' || buf[offset] == '\0')
        offset--;
    buf[++offset] = '\n';
    buf[++offset] = '\0';

    int ret = ::write(STDERR_FILENO, buf, ::strlen(buf));
    // avoid the "variable set but not use" warning
    ClearUnuseVariableWarning(ret);

    //    queue_.push_notify(std::string(buf));
}